

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

ostringstream * __thiscall
wasm::ValidationInfo::printFailureHeader_abi_cxx11_(ValidationInfo *this,Function *func)

{
  ostream *o;
  ostringstream *stream_00;
  Name name;
  ostringstream *stream;
  Function *func_local;
  ValidationInfo *this_local;
  
  stream_00 = getStream_abi_cxx11_(this,func);
  if ((this->quiet & 1U) == 0) {
    Colors::red((ostream *)stream_00);
    if (func == (Function *)0x0) {
      std::operator<<((ostream *)stream_00,"[wasm-validator error in module] ");
    }
    else {
      std::operator<<((ostream *)stream_00,"[wasm-validator error in function ");
      Colors::green((ostream *)stream_00);
      o = (ostream *)(func->super_Importable).super_Named.name.super_IString.str._M_len;
      name.super_IString.str._M_str = (char *)o;
      name.super_IString.str._M_len =
           (size_t)(func->super_Importable).super_Named.name.super_IString.str._M_str;
      wasm::operator<<((wasm *)stream_00,o,name);
      Colors::red((ostream *)stream_00);
      std::operator<<((ostream *)stream_00,"] ");
    }
    Colors::normal((ostream *)stream_00);
  }
  return stream_00;
}

Assistant:

std::ostringstream& printFailureHeader(Function* func) {
    auto& stream = getStream(func);
    if (quiet) {
      return stream;
    }
    Colors::red(stream);
    if (func) {
      stream << "[wasm-validator error in function ";
      Colors::green(stream);
      stream << func->name;
      Colors::red(stream);
      stream << "] ";
    } else {
      stream << "[wasm-validator error in module] ";
    }
    Colors::normal(stream);
    return stream;
  }